

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<double,_3,_3> *
tcu::operator*(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *mtx,double scalar)

{
  Matrix<double,_3,_3> *pMVar1;
  int col;
  long lVar2;
  int row_1;
  double *pdVar3;
  Matrix<double,_3,_3> *res;
  int row;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  
  pMVar1 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar2 = 0;
  lVar4 = 0;
  pdVar3 = (double *)__return_storage_ptr__;
  do {
    lVar5 = 0;
    do {
      uVar6 = 0x3ff0000000000000;
      if (lVar2 != lVar5) {
        uVar6 = 0;
      }
      *(undefined8 *)((long)pdVar3 + lVar5) = uVar6;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x48);
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + 0x18;
  } while (lVar4 != 3);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      ((Vector<tcu::Vector<double,_3>,_3> *)((Vector<double,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar4] =
           ((Vector<tcu::Vector<double,_3>,_3> *)((Vector<double,_3> *)mtx)->m_data)->m_data[0].
           m_data[lVar4] * scalar;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    __return_storage_ptr__ = (Matrix<double,_3,_3> *)((long)__return_storage_ptr__ + 0x18);
    mtx = (Matrix<double,_3,_3> *)((long)mtx + 0x18);
  } while (lVar2 != 3);
  return pMVar1;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}